

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSeparateShaderTests.cpp
# Opt level: O2

void __thiscall
deqp::gles31::Functional::anon_unknown_0::SeparateShaderTest::setUniform
          (SeparateShaderTest *this,ProgramWrapper *program,string *uniformName,GLfloat value,
          bool useProgramUniform)

{
  CallLogWrapper *this_00;
  ostringstream *this_01;
  GLuint program_00;
  GLint location;
  MessageBuilder msg;
  undefined1 local_1b0 [384];
  
  program_00 = (*program->_vptr_ProgramWrapper[2])(program);
  this_00 = &this->super_CallLogWrapper;
  location = glu::CallLogWrapper::glGetUniformLocation
                       (this_00,program_00,(uniformName->_M_dataplus)._M_p);
  local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  this_01 = (ostringstream *)(local_1b0 + 8);
  std::__cxx11::ostringstream::ostringstream(this_01);
  std::operator<<((ostream *)this_01,"// Set program ");
  std::ostream::_M_insert<unsigned_long>((ulong)this_01);
  std::operator<<((ostream *)this_01,"\'s uniform \'");
  std::operator<<((ostream *)this_01,(string *)uniformName);
  std::operator<<((ostream *)this_01,"\' to ");
  std::ostream::operator<<(this_01,value);
  if (useProgramUniform) {
    std::operator<<((ostream *)this_01," using glProgramUniform1f");
    glu::CallLogWrapper::glProgramUniform1f(this_00,program_00,location,value);
  }
  else {
    std::operator<<((ostream *)this_01," using glUseProgram and glUniform1f");
    glu::CallLogWrapper::glUseProgram(this_00,program_00);
    glu::CallLogWrapper::glUniform1f(this_00,location,value);
    glu::CallLogWrapper::glUseProgram(this_00,0);
  }
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(this_01);
  return;
}

Assistant:

void SeparateShaderTest::setUniform (ProgramWrapper&	program,
									 const string&		uniformName,
									 GLfloat			value,
									 bool				useProgramUniform)
{
	const GLuint		progName	= program.getProgramName();
	const GLint			location	= glGetUniformLocation(progName, uniformName.c_str());
	MessageBuilder		msg			= log().message();

	msg << "// Set program " << progName << "'s uniform '" << uniformName << "' to " << value;
	if (useProgramUniform)
	{
		msg << " using glProgramUniform1f";
		glProgramUniform1f(progName, location, value);
	}
	else
	{
		msg << " using glUseProgram and glUniform1f";
		glUseProgram(progName);
		glUniform1f(location, value);
		glUseProgram(0);
	}
	msg << TestLog::EndMessage;
}